

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O3

int AF_A_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *player;
  AWeapon *this;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  void *pvVar7;
  FState *flashstate;
  PClassActor *type;
  AActor *source;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  bool bVar10;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bdbed;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bdbdd;
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_005bda6e;
    pPVar6 = (source->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(source->super_DThinker).super_DObject._vptr_DObject)(source);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (source->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar9 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar9;
    bVar10 = pPVar6 == pPVar3;
    if (!bVar10 && !bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar10 || bVar9);
    uVar5 = (uint)bVar9;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bdbed;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_005bdbdd;
LAB_005bda6e:
    source = (AActor *)0x0;
    pVVar8 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bdbdd:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bdbed;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar6 = (PClass *)puVar2[1];
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
            puVar2[1] = pPVar6;
          }
          bVar9 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar3 && bVar9) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar9 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar3) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar9) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bdbed;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005bdbdd;
    }
    if ((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar7 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005bdb32;
        if (pvVar7 == (void *)0x0) goto LAB_005bdb30;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bdbed:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005bdb30:
  pvVar7 = (void *)0x0;
LAB_005bdb32:
  player = source->player;
  if (player != (player_t *)0x0) {
    this = player->ReadyWeapon;
    if ((pvVar7 != (void *)0x0 && this != (AWeapon *)0x0) && (*(int *)((long)pvVar7 + 8) == 1)) {
      bVar9 = AWeapon::DepleteAmmo(this,this->bAltFire,true,1);
      if (!bVar9) {
        return 0;
      }
      local_2c.Index = 0xa3;
      flashstate = AActor::FindState((AActor *)this,&local_2c);
      if (flashstate != (FState *)0x0) {
        uVar5 = FRandom::GenRand32(&pr_fireplasma);
        P_SetSafeFlash(this,player,flashstate,uVar5 & 1);
      }
    }
    type = PClass::FindActor("PlasmaBall");
    P_SpawnPlayerMissile(source,type);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != NULL)
		{
			P_SetSafeFlash(weapon, player, flash, (pr_fireplasma()&1));
		}
	}

	P_SpawnPlayerMissile (self, PClass::FindActor("PlasmaBall"));
	return 0;
}